

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O2

void __thiscall
cereal::PortableBinaryInputArchive::loadBinary<2ul>
          (PortableBinaryInputArchive *this,void *data,size_t size)

{
  ushort *puVar1;
  size_t i;
  unsigned_long __val;
  ulong uVar2;
  Exception *this_00;
  string sStack_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __val = (**(code **)(**(long **)(this->itsStream +
                                  *(long *)(*(long *)this->itsStream + -0x18) + 0xe8) + 0x40))();
  if (__val == size) {
    if (this->itsConvertEndianness != '\0') {
      for (uVar2 = 0; uVar2 < size; uVar2 = uVar2 + 2) {
        puVar1 = (ushort *)((long)data + uVar2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a8,size);
  std::operator+(&local_88,"Failed to read ",&local_a8);
  std::operator+(&local_68,&local_88," bytes from input stream! Read ");
  std::__cxx11::to_string(&sStack_c8,__val);
  std::operator+(&local_48,&local_68,&sStack_c8);
  Exception::Exception(this_00,&local_48);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
      void loadBinary( void * const data, std::size_t size )
      {
        // load data
        auto const readSize = static_cast<std::size_t>( itsStream.rdbuf()->sgetn( reinterpret_cast<char*>( data ), size ) );

        if(readSize != size)
          throw Exception("Failed to read " + std::to_string(size) + " bytes from input stream! Read " + std::to_string(readSize));

        // flip bits if needed
        if( itsConvertEndianness )
        {
          std::uint8_t * ptr = reinterpret_cast<std::uint8_t*>( data );
          for( std::size_t i = 0; i < size; i += DataSize )
            portable_binary_detail::swap_bytes<DataSize>( ptr + i );
        }
      }